

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O0

CURLcode ftp_pl_insert_finfo(connectdata *conn,fileinfo *infop)

{
  Curl_easy *pCVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *str;
  curl_fileinfo *finfo;
  _Bool add;
  ftp_parselist_data *parser;
  curl_llist *llist;
  ftp_wc_tmpdata *tmpdata;
  WildcardData *wc;
  curl_fnmatch_callback compare;
  fileinfo *infop_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  plVar2 = (long *)(pCVar1->wildcard).tmp;
  lVar3 = *plVar2;
  bVar4 = true;
  local_78 = (infop->info).b_data;
  (infop->info).filename = local_78 + *(long *)(lVar3 + 0x28);
  if (*(long *)(lVar3 + 0x38) == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = local_78 + *(long *)(lVar3 + 0x38);
  }
  (infop->info).strings.group = local_60;
  if (*(long *)(lVar3 + 0x48) == 0) {
    local_68 = (char *)0x0;
  }
  else {
    local_68 = local_78 + *(long *)(lVar3 + 0x48);
  }
  (infop->info).strings.perm = local_68;
  if (*(long *)(lVar3 + 0x50) == 0) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = local_78 + *(long *)(lVar3 + 0x50);
  }
  (infop->info).strings.target = local_70;
  (infop->info).strings.time = local_78 + *(long *)(lVar3 + 0x40);
  if (*(long *)(lVar3 + 0x30) == 0) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = local_78 + *(long *)(lVar3 + 0x30);
  }
  (infop->info).strings.user = local_78;
  wc = (WildcardData *)(conn->data->set).fnmatch;
  if (wc == (WildcardData *)0x0) {
    wc = (WildcardData *)Curl_fnmatch;
  }
  iVar5 = (*(code *)wc)((conn->data->set).fnmatch_data,(pCVar1->wildcard).pattern,
                        (infop->info).filename);
  if (iVar5 == 0) {
    if ((((infop->info).filetype == CURLFILETYPE_SYMLINK) &&
        ((infop->info).strings.target != (char *)0x0)) &&
       (pcVar6 = strstr((infop->info).strings.target," -> "), pcVar6 != (char *)0x0)) {
      bVar4 = false;
    }
  }
  else {
    bVar4 = false;
  }
  if (bVar4) {
    Curl_llist_insert_next
              (&(pCVar1->wildcard).filelist,(pCVar1->wildcard).filelist.tail,infop,&infop->list);
  }
  else {
    Curl_fileinfo_dtor((void *)0x0,infop);
  }
  *(undefined8 *)(*plVar2 + 0x10) = 0;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct fileinfo *infop)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc_tmpdata *tmpdata = wc->tmp;
  struct curl_llist *llist = &wc->filelist;
  struct ftp_parselist_data *parser = tmpdata->parser;
  bool add = TRUE;
  struct curl_fileinfo *finfo = &infop->info;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }

  if(add) {
    Curl_llist_insert_next(llist, llist->tail, finfo, &infop->list);
  }
  else {
    Curl_fileinfo_dtor(NULL, finfo);
  }

  tmpdata->parser->file_data = NULL;
  return CURLE_OK;
}